

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_set_list_item_count(AMQP_VALUE value,uint32_t list_size)

{
  LOGGER_LOG p_Var1;
  void *pvVar2;
  AMQP_VALUE pAVar3;
  size_t local_70;
  size_t local_68;
  uint local_60;
  uint local_5c;
  uint32_t i_1;
  uint32_t j;
  LOGGER_LOG l_3;
  uint32_t i;
  LOGGER_LOG l_2;
  size_t realloc_size;
  AMQP_VALUE *new_list;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  int result;
  uint32_t list_size_local;
  AMQP_VALUE value_local;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_set_list_item_count",0x4ee,1,"NULL list value");
    }
    l._0_4_ = 0x4ef;
  }
  else if (value->type == AMQP_TYPE_LIST) {
    if ((value->value).binary_value.length < list_size) {
      if (list_size == 0) {
        local_68 = 0;
      }
      else {
        if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / ZEXT416(list_size),0) < 8) {
          local_70 = 0xffffffffffffffff;
        }
        else {
          local_70 = (ulong)list_size << 3;
        }
        local_68 = local_70;
      }
      if ((local_68 == 0xffffffffffffffff) ||
         (pvVar2 = realloc((value->value).binary_value.bytes,local_68), pvVar2 == (void *)0x0)) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_set_list_item_count",0x506,1,
                    "Could not reallocate list memory, size:%zu",local_68);
        }
        l._0_4_ = 0x507;
      }
      else {
        (value->value).binary_value.bytes = pvVar2;
        for (l_3._4_4_ = (value->value).binary_value.length; l_3._4_4_ < list_size;
            l_3._4_4_ = l_3._4_4_ + 1) {
          pAVar3 = amqpvalue_create_null();
          *(AMQP_VALUE *)((long)pvVar2 + (ulong)l_3._4_4_ * 8) = pAVar3;
          if (*(long *)((long)pvVar2 + (ulong)l_3._4_4_ * 8) == 0) {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                        ,"amqpvalue_set_list_item_count",0x514,1,
                        "Could not create NULL AMQP value to be inserted in list");
            }
            break;
          }
        }
        if (l_3._4_4_ < list_size) {
          for (local_5c = (value->value).binary_value.length; local_5c < l_3._4_4_;
              local_5c = local_5c + 1) {
            amqpvalue_destroy(*(AMQP_VALUE *)((long)pvVar2 + (ulong)local_5c * 8));
          }
          l._0_4_ = 0x522;
        }
        else {
          (value->value).binary_value.length = list_size;
          l._0_4_ = 0;
        }
      }
    }
    else {
      local_60 = list_size;
      if (list_size < (value->value).binary_value.length) {
        for (; local_60 < (value->value).binary_value.length; local_60 = local_60 + 1) {
          amqpvalue_destroy(*(AMQP_VALUE *)
                             (&((value->value).described_value.descriptor)->type +
                             (ulong)local_60 * 2));
        }
        (value->value).binary_value.length = list_size;
      }
      l._0_4_ = 0;
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_set_list_item_count",0x4f7,1,"Value is not of type LIST");
    }
    l._0_4_ = 0x4f8;
  }
  return (int)l;
}

Assistant:

int amqpvalue_set_list_item_count(AMQP_VALUE value, uint32_t list_size)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_155: [If the value argument is NULL, amqpvalue_set_list_item_count shall return a non-zero value.] */
    if (value == NULL)
    {
        LogError("NULL list value");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if (value_data->type != AMQP_TYPE_LIST)
        {
            /* Codes_SRS_AMQPVALUE_01_156: [If the value is not of type list, then amqpvalue_set_list_item_count shall return a non-zero value.] */
            LogError("Value is not of type LIST");
            result = MU_FAILURE;
        }
        else
        {
            if (value_data->value.list_value.count < list_size)
            {
                AMQP_VALUE* new_list;

                /* Codes_SRS_AMQPVALUE_01_152: [amqpvalue_set_list_item_count shall resize an AMQP list.] */
                size_t realloc_size = safe_multiply_size_t(list_size, sizeof(AMQP_VALUE));
                if (realloc_size == SIZE_MAX ||
                    (new_list = (AMQP_VALUE*)realloc(value_data->value.list_value.items, realloc_size)) == NULL)
                {
                    /* Codes_SRS_AMQPVALUE_01_154: [If allocating memory for the list according to the new size fails, then amqpvalue_set_list_item_count shall return a non-zero value, while preserving the existing list contents.] */
                    LogError("Could not reallocate list memory, size:%zu", realloc_size);
                    result = MU_FAILURE;
                }
                else
                {
                    uint32_t i;
                    value_data->value.list_value.items = new_list;

                    /* Codes_SRS_AMQPVALUE_01_162: [When a list is grown a null AMQP_VALUE shall be inserted as new list items to fill the list up to the new size.] */
                    for (i = value_data->value.list_value.count; i < list_size; i++)
                    {
                        new_list[i] = amqpvalue_create_null();
                        if (new_list[i] == NULL)
                        {
                            LogError("Could not create NULL AMQP value to be inserted in list");
                            break;
                        }
                    }

                    if (i < list_size)
                    {
                        /* Codes_SRS_AMQPVALUE_01_154: [If allocating memory for the list according to the new size fails, then amqpvalue_set_list_item_count shall return a non-zero value, while preserving the existing list contents.] */
                        uint32_t j;
                        for (j = value_data->value.list_value.count; j < i; j++)
                        {
                            amqpvalue_destroy(new_list[j]);
                        }

                        result = MU_FAILURE;
                    }
                    else
                    {
                        value_data->value.list_value.count = list_size;

                        /* Codes_SRS_AMQPVALUE_01_153: [On success amqpvalue_set_list_item_count shall return 0.] */
                        result = 0;
                    }
                }
            }
            else if (value_data->value.list_value.count > list_size)
            {
                uint32_t i;

                /* Codes_SRS_AMQPVALUE_01_161: [When the list is shrunk, the extra items shall be freed by using amqp_value_destroy.] */
                for (i = list_size; i < value_data->value.list_value.count; i++)
                {
                    amqpvalue_destroy(value_data->value.list_value.items[i]);
                }

                value_data->value.list_value.count = list_size;

                /* Codes_SRS_AMQPVALUE_01_153: [On success amqpvalue_set_list_item_count shall return 0.] */
                result = 0;
            }
            else
            {
                /* Codes_SRS_AMQPVALUE_01_153: [On success amqpvalue_set_list_item_count shall return 0.] */
                result = 0;
            }
        }
    }

    return result;
}